

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O0

void __thiscall Fluid_Table::DrawHeader(Fluid_Table *this,char *s,int X,int Y,int W,int H)

{
  Fl_Color c;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  char *s_local;
  Fluid_Table *this_local;
  
  fl_push_clip(X,Y,W,H);
  c = Fl_Table::row_header_color(&this->super_Fl_Table);
  fl_draw_box(FL_THIN_UP_BOX,X,Y,W,H,c);
  fl_color(0x38);
  fl_draw(s,X,Y,W,H,0,(Fl_Image *)0x0,1);
  fl_pop_clip();
  return;
}

Assistant:

void DrawHeader(const char *s, int X, int Y, int W, int H) {
    fl_push_clip(X,Y,W,H);
    fl_draw_box(FL_THIN_UP_BOX, X,Y,W,H, row_header_color());
    fl_color(FL_BLACK);
    fl_draw(s, X,Y,W,H, FL_ALIGN_CENTER);
    fl_pop_clip();
  }